

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O3

void aalcalcmeanonly::LoadOccurrence(void)

{
  int iVar1;
  FILE *pFVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  undefined8 extraout_RAX;
  char *pcVar5;
  int dateOpts;
  occurrence occ;
  undefined4 uStack_a4;
  undefined1 *apuStack_a0 [2];
  undefined1 auStack_90 [16];
  long *plStack_80;
  char *pcStack_78;
  ulong uStack_70;
  char acStack_68 [16];
  uint local_24;
  occurrence_granular local_20;
  
  pcVar5 = "input/occurrence.bin";
  pFVar2 = fopen("input/occurrence.bin","rb");
  if (pFVar2 != (FILE *)0x0) {
    fread(&local_24,4,1,pFVar2);
    if (local_24 < 2) {
      LoadOccurrence<occurrence>((occurrence *)&local_20,(FILE *)pFVar2);
    }
    else {
      LoadOccurrence<occurrence_granular>(&local_20,(FILE *)pFVar2);
    }
    return;
  }
  LoadOccurrence();
  plStack_80 = (long *)pcVar5;
  __dirp = opendir(*(char **)pcVar5);
  if (__dirp != (DIR *)0x0) {
    pdVar3 = readdir(__dirp);
    if (pdVar3 != (dirent *)0x0) {
      do {
        pcStack_78 = acStack_68;
        sVar4 = strlen(pdVar3->d_name);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&pcStack_78,pdVar3->d_name,pdVar3->d_name + sVar4);
        if (4 < uStack_70) {
          std::__cxx11::string::substr((ulong)apuStack_a0,(ulong)&pcStack_78);
          iVar1 = std::__cxx11::string::compare((char *)apuStack_a0);
          if (apuStack_a0[0] != auStack_90) {
            operator_delete(apuStack_a0[0]);
          }
          if (iVar1 == 0) {
            apuStack_a0[0] = auStack_90;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)apuStack_a0,*plStack_80,plStack_80[1] + *plStack_80);
            std::__cxx11::string::append((char *)apuStack_a0);
            std::__cxx11::string::operator=((string *)&pcStack_78,(string *)apuStack_a0);
            if (apuStack_a0[0] != auStack_90) {
              operator_delete(apuStack_a0[0]);
            }
            pFVar2 = fopen(pcStack_78,"rb");
            if (pFVar2 == (FILE *)0x0) {
LAB_00102a68:
              ReadFilesInDirectory((aalcalcmeanonly *)&pcStack_78);
              if (pcStack_78 != acStack_68) {
                operator_delete(pcStack_78);
              }
              _Unwind_Resume(extraout_RAX);
            }
            apuStack_a0[0] = (undefined1 *)((ulong)apuStack_a0[0] & 0xffffffff00000000);
            fread((string *)apuStack_a0,4,1,pFVar2);
            if ((int)apuStack_a0[0] != 0x3000001) {
              ReadFilesInDirectory((aalcalcmeanonly *)((ulong)apuStack_a0[0] & 0xffffffff));
              goto LAB_00102a68;
            }
            fread(&sampleSize_,4,1,pFVar2);
            uStack_a4 = 0;
            fread(&uStack_a4,4,1,pFVar2);
            ReadInputStream((FILE *)pFVar2);
            fclose(pFVar2);
          }
        }
        if (pcStack_78 != acStack_68) {
          operator_delete(pcStack_78);
        }
        pdVar3 = readdir(__dirp);
      } while (pdVar3 != (dirent *)0x0);
    }
  }
  return;
}

Assistant:

void LoadOccurrence() {

    int dateOpts;
    int granularDate = 0;
    FILE *fin = fopen(OCCURRENCE_FILE, "rb");
    if (fin == nullptr) {
      fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, OCCURRENCE_FILE);
      exit(EXIT_FAILURE);
    }

    fread(&dateOpts, sizeof(dateOpts), 1, fin);
    granularDate = dateOpts >> 1;
    if (granularDate) {
      occurrence_granular occ;
      LoadOccurrence(occ, fin);
    } else {
      occurrence occ;
      LoadOccurrence(occ, fin);
    }

  }